

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

Nwk_Vrt_t * Nwk_ManGraphListFindMinEdge(Nwk_Grf_t *p,Nwk_Vrt_t *pVert)

{
  Nwk_Vrt_t *pNVar1;
  long lVar2;
  
  if (0 < (long)pVert->nEdges) {
    lVar2 = 0;
    pNVar1 = (Nwk_Vrt_t *)0x0;
    do {
      if ((pNVar1 == (Nwk_Vrt_t *)0x0) ||
         (p->pVerts[(&pVert[1].Id)[lVar2]]->nEdges < pNVar1->nEdges)) {
        pNVar1 = p->pVerts[(&pVert[1].Id)[lVar2]];
      }
      lVar2 = lVar2 + 1;
    } while (pVert->nEdges != lVar2);
    return pNVar1;
  }
  return (Nwk_Vrt_t *)0x0;
}

Assistant:

Nwk_Vrt_t * Nwk_ManGraphListFindMinEdge( Nwk_Grf_t * p, Nwk_Vrt_t * pVert )
{
    Nwk_Vrt_t * pThis, * pMinCost = NULL;
    int k;
    Nwk_VertexForEachAdjacent( p, pVert, pThis, k )
    {
        if ( pMinCost == NULL || pMinCost->nEdges > pThis->nEdges )
            pMinCost = pThis;
    }
    return pMinCost;
}